

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PackageSymbol::PackageSymbol
          (PackageSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          NetType *defaultNetType,VariableLifetime defaultLifetime)

{
  (this->super_Symbol).kind = Package;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->defaultNetType = defaultNetType;
  (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  this->defaultLifetime = defaultLifetime;
  (this->exportDecls)._M_ptr = (pointer)0x0;
  (this->exportDecls)._M_extent._M_extent_value = 0;
  this->hasExportAll = false;
  return;
}

Assistant:

PackageSymbol::PackageSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                             const NetType& defaultNetType, VariableLifetime defaultLifetime) :
    Symbol(SymbolKind::Package, name, loc), Scope(compilation, this),
    defaultNetType(defaultNetType), defaultLifetime(defaultLifetime) {
}